

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O3

void window_uncommon_slot(Am_Slot first_invalidated)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  Am_Value *pAVar7;
  Am_Wrapper *pAVar8;
  Am_Cursor *this;
  Am_Wrapper *pAVar9;
  Am_Object owner;
  Am_Object window;
  Am_Object local_70;
  Am_Object local_68;
  Am_Window_ToDo *local_60;
  long *local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40 [2];
  
  Am_Slot::Get_Owner((Am_Slot *)&local_70);
  Am_Object::Am_Object(&local_68,&local_70);
  Am_Object::~Am_Object(&local_70);
  pAVar7 = Am_Object::Get(&local_68,0x7d2,0);
  local_58 = (long *)Am_Value::operator_cast_to_void_(pAVar7);
  if (local_58 == (long *)0x0) goto LAB_001eddba;
  pAVar7 = Am_Object::Get(&local_68,0x7d6,0);
  local_60 = (Am_Window_ToDo *)Am_Value::operator_cast_to_void_(pAVar7);
  lVar4 = local_58[5];
  pAVar7 = Am_Object::Get(&local_68,0x69,0);
  bVar5 = Am_Value::operator_cast_to_bool(pAVar7);
  if (bVar5 != (bool)(char)lVar4) {
    *(byte *)&local_60->flags = (byte)local_60->flags | 0x10;
    Am_Window_ToDo::Add(local_60);
  }
  pAVar7 = Am_Object::Get(&local_68,0x6c,0);
  Am_String::Am_String((Am_String *)&local_70,pAVar7);
  bVar5 = Am_String::operator==((Am_String *)&local_70,(char *)local_58[3]);
  Am_String::~Am_String((Am_String *)&local_70);
  if (!bVar5) {
    *(byte *)&local_60->flags = (byte)local_60->flags | 0x80;
    Am_Window_ToDo::Add(local_60);
  }
  pAVar7 = Am_Object::Get(&local_68,0x6d,0);
  Am_String::Am_String((Am_String *)&local_70,pAVar7);
  bVar5 = Am_String::operator==((Am_String *)&local_70,(char *)local_58[4]);
  Am_String::~Am_String((Am_String *)&local_70);
  if (!bVar5) {
    pbVar1 = (byte *)((long)&local_60->flags + 1);
    *pbVar1 = *pbVar1 | 1;
    Am_Window_ToDo::Add(local_60);
  }
  cVar2 = *(char *)((long)local_58 + 0x29);
  pAVar7 = Am_Object::Get(&local_68,0x76,0);
  bVar5 = Am_Value::operator_cast_to_bool(pAVar7);
  if (bVar5 != (bool)cVar2) {
    pbVar1 = (byte *)((long)&local_60->flags + 1);
    *pbVar1 = *pbVar1 | 0x20;
    Am_Window_ToDo::Add(local_60);
  }
  lVar4 = local_58[10];
  pAVar7 = Am_Object::Get(&local_68,0x79,0);
  bVar5 = Am_Value::operator_cast_to_bool(pAVar7);
  if ((bool)(char)lVar4 == bVar5) {
    Am_Object::Get_Object(&local_70,(Am_Slot_Key)&local_68,10);
    while (pAVar8 = Am_Object::operator_cast_to_Am_Wrapper_(&local_70), pAVar8 != (Am_Wrapper *)0x0)
    {
      Am_Object::Am_Object(local_40,&Am_Screen);
      bVar5 = Am_Object::Is_Instance_Of(&local_70,local_40);
      Am_Object::~Am_Object(local_40);
      if (bVar5) {
        pbVar1 = (byte *)((long)&local_60->flags + 1);
        *pbVar1 = *pbVar1 | 2;
        Am_Window_ToDo::Add(local_60);
        break;
      }
      Am_Object::Am_Object(&local_48,&Am_Window);
      bVar5 = Am_Object::Is_Instance_Of(&local_70,&local_48);
      Am_Object::~Am_Object(&local_48);
      if (bVar5) break;
      Am_Object::Get_Object(&local_50,(Am_Slot_Key)&local_70,10);
      Am_Object::operator=(&local_70,&local_50);
      Am_Object::~Am_Object(&local_50);
    }
    Am_Object::~Am_Object(&local_70);
  }
  pAVar7 = Am_Object::Get(&local_68,0x6a,0);
  Am_Style::Am_Style((Am_Style *)&local_70,pAVar7);
  bVar5 = Am_Style::operator!=((Am_Style *)(local_58 + 6),(Am_Style *)&local_70);
  Am_Style::~Am_Style((Am_Style *)&local_70);
  if (bVar5) {
    pbVar1 = (byte *)((long)&local_60->flags + 1);
    *pbVar1 = *pbVar1 | 4;
    Am_Window_ToDo::Add(local_60);
  }
  this = (Am_Cursor *)(**(code **)(*local_58 + 0x1c8))();
  pAVar8 = Am_Cursor::operator_cast_to_Am_Wrapper_(this);
  pAVar7 = Am_Object::Get(&local_68,0x7e,0);
  Am_Cursor::Am_Cursor((Am_Cursor *)&local_70,pAVar7);
  pAVar9 = Am_Cursor::operator_cast_to_Am_Wrapper_((Am_Cursor *)&local_70);
  Am_Cursor::~Am_Cursor((Am_Cursor *)&local_70);
  if (pAVar8 != pAVar9) {
    pbVar1 = (byte *)((long)&local_60->flags + 1);
    *pbVar1 = *pbVar1 | 0x80;
    Am_Window_ToDo::Add(local_60);
  }
  lVar4 = local_58[8];
  iVar3 = *(int *)((long)local_58 + 0x44);
  pAVar7 = Am_Object::Get(&local_68,0x74,0);
  bVar5 = Am_Value::operator_cast_to_bool(pAVar7);
  if (bVar5) {
    pAVar7 = Am_Object::Get(&local_68,0x70,0);
    iVar6 = Am_Value::operator_cast_to_int(pAVar7);
    if ((int)lVar4 != iVar6) {
LAB_001edcb6:
      pbVar1 = (byte *)((long)&local_60->flags + 1);
      *pbVar1 = *pbVar1 | 8;
      Am_Window_ToDo::Add(local_60);
    }
  }
  else if ((int)lVar4 != 1) goto LAB_001edcb6;
  pAVar7 = Am_Object::Get(&local_68,0x75,0);
  bVar5 = Am_Value::operator_cast_to_bool(pAVar7);
  if (bVar5) {
    pAVar7 = Am_Object::Get(&local_68,0x71,0);
    iVar6 = Am_Value::operator_cast_to_int(pAVar7);
    if (iVar3 != iVar6) {
LAB_001edd05:
      pbVar1 = (byte *)((long)&local_60->flags + 1);
      *pbVar1 = *pbVar1 | 8;
      Am_Window_ToDo::Add(local_60);
    }
  }
  else if (iVar3 != 1) goto LAB_001edd05;
  lVar4 = local_58[9];
  iVar3 = *(int *)((long)local_58 + 0x4c);
  pAVar7 = Am_Object::Get(&local_68,0x72,0);
  bVar5 = Am_Value::operator_cast_to_bool(pAVar7);
  if (bVar5) {
    pAVar7 = Am_Object::Get(&local_68,0x6e,0);
    iVar6 = Am_Value::operator_cast_to_int(pAVar7);
    if ((int)lVar4 != iVar6) {
LAB_001edd5e:
      pbVar1 = (byte *)((long)&local_60->flags + 1);
      *pbVar1 = *pbVar1 | 0x10;
      Am_Window_ToDo::Add(local_60);
    }
  }
  else if ((int)lVar4 != 0) goto LAB_001edd5e;
  pAVar7 = Am_Object::Get(&local_68,0x73,0);
  bVar5 = Am_Value::operator_cast_to_bool(pAVar7);
  if (bVar5) {
    pAVar7 = Am_Object::Get(&local_68,0x6f,0);
    iVar6 = Am_Value::operator_cast_to_int(pAVar7);
    if (iVar3 == iVar6) goto LAB_001eddba;
  }
  else if (iVar3 == 0) goto LAB_001eddba;
  pbVar1 = (byte *)((long)&local_60->flags + 1);
  *pbVar1 = *pbVar1 | 0x10;
  Am_Window_ToDo::Add(local_60);
LAB_001eddba:
  Am_Object::~Am_Object(&local_68);
  return;
}

Assistant:

static void
window_uncommon_slot(Am_Slot first_invalidated)
{
  Am_Object window = first_invalidated.Get_Owner();
  Am_Drawonable *drawonable = Am_Drawonable::Narrow(window.Get(Am_DRAWONABLE));
  if (drawonable) {
    Am_Window_ToDo *win_todo = Am_Window_ToDo::Narrow(window.Get(Am_TODO));
    if (drawonable->Get_Visible() != (bool)window.Get(Am_VISIBLE)) {
      win_todo->flags |= Am_WINTODO_VISIBLE;
      win_todo->Add();
    }
    if (!(Am_String(window.Get(Am_TITLE)) == drawonable->Get_Title())) {
      win_todo->flags |= Am_WINTODO_TITLE;
      win_todo->Add();
    }
    if (!(Am_String(window.Get(Am_ICON_TITLE)) ==
          drawonable->Get_Icon_Title())) {
      win_todo->flags |= Am_WINTODO_ICON_TITLE;
      win_todo->Add();
    }
    if (drawonable->Get_Iconify() != (bool)window.Get(Am_ICONIFIED)) {
      win_todo->flags |= Am_WINTODO_ICONIFY;
      win_todo->Add();
    }
    bool title_p;
    drawonable->Get_Titlebar(title_p);
    if (title_p == (bool)window.Get(Am_OMIT_TITLE_BAR)) {
      Am_Object owner = window.Get_Owner();
      while (owner) {
        if (owner.Is_Instance_Of(Am_Screen)) {
          win_todo->flags |= Am_WINTODO_TITLE_BAR;
          win_todo->Add();
          break;
        } else if (owner.Is_Instance_Of(Am_Window))
          break;
        owner = owner.Get_Owner();
      }
    }
    if (drawonable->Get_Background_Color() !=
        Am_Style(window.Get(Am_FILL_STYLE))) {
      win_todo->flags |= Am_WINTODO_FILL_STYLE;
      win_todo->Add();
    }
    if (drawonable->Get_Cursor() != (Am_Cursor)window.Get(Am_CURSOR)) {
      win_todo->flags |= Am_WINTODO_CURSOR;
      win_todo->Add();
    }
    int width, height;
    drawonable->Get_Min_Size(width, height);
    if ((bool)window.Get(Am_USE_MIN_WIDTH)) {
      if (width != (int)window.Get(Am_MIN_WIDTH)) {
        win_todo->flags |= Am_WINTODO_MIN_SIZE;
        win_todo->Add();
      }
    } else if (width != 1) {
      win_todo->flags |= Am_WINTODO_MIN_SIZE;
      win_todo->Add();
    }
    if ((bool)window.Get(Am_USE_MIN_HEIGHT)) {
      if (height != (int)window.Get(Am_MIN_HEIGHT)) {
        win_todo->flags |= Am_WINTODO_MIN_SIZE;
        win_todo->Add();
      }
    } else if (height != 1) {
      win_todo->flags |= Am_WINTODO_MIN_SIZE;
      win_todo->Add();
    }
    drawonable->Get_Max_Size(width, height);
    if ((bool)window.Get(Am_USE_MAX_WIDTH)) {
      if (width != (int)window.Get(Am_MAX_WIDTH)) {
        win_todo->flags |= Am_WINTODO_MAX_SIZE;
        win_todo->Add();
      }
    } else if (width != 0) {
      win_todo->flags |= Am_WINTODO_MAX_SIZE;
      win_todo->Add();
    }
    if ((bool)window.Get(Am_USE_MAX_HEIGHT)) {
      if (height != (int)window.Get(Am_MAX_HEIGHT)) {
        win_todo->flags |= Am_WINTODO_MAX_SIZE;
        win_todo->Add();
      }
    } else if (height != 0) {
      win_todo->flags |= Am_WINTODO_MAX_SIZE;
      win_todo->Add();
    }
    //// NDY: These need to be defined in gem.
    // Am_CLIP_CHILDREN  Am_WINTODO_CLIP
    // Am_SAVE_UNDER     Am_WINTODO_SAVE_UNDER
  }
}